

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_app_writer.c
# Opt level: O3

int main(int argc,char **argv)

{
  char *pcVar1;
  int iVar2;
  mbedtls_pk_type_t mVar3;
  char *pcVar4;
  mbedtls_mpi *X;
  char *pcVar5;
  char *__s1;
  ulong uVar6;
  mbedtls_pk_context key;
  mbedtls_mpi E;
  mbedtls_mpi N;
  mbedtls_mpi QP;
  mbedtls_mpi DQ;
  mbedtls_mpi DP;
  mbedtls_mpi D;
  mbedtls_mpi Q;
  mbedtls_mpi P;
  char buf [1024];
  mbedtls_pk_context mStack_508;
  mbedtls_mpi local_4f8;
  mbedtls_mpi local_4e0;
  mbedtls_mpi local_4c8;
  mbedtls_mpi local_4b0;
  mbedtls_mpi local_498;
  mbedtls_mpi local_480;
  mbedtls_mpi local_468;
  mbedtls_mpi local_450;
  char local_438 [1032];
  
  mbedtls_pk_init(&mStack_508);
  memset(local_438,0,0x400);
  mbedtls_mpi_init(&local_4e0);
  mbedtls_mpi_init(&local_450);
  mbedtls_mpi_init(&local_468);
  mbedtls_mpi_init(&local_480);
  mbedtls_mpi_init(&local_4f8);
  mbedtls_mpi_init(&local_498);
  mbedtls_mpi_init(&local_4b0);
  mbedtls_mpi_init(&local_4c8);
  if (argc == 0) {
LAB_0010b626:
    printf(
          "\n usage: key_app_writer param=<>...\n\n acceptable parameters:\n    mode=private|public default: none\n    filename=%%s         default: keyfile.key\n    output_mode=private|public default: none\n    output_file=%%s      default: keyfile.pem\n    output_format=pem|der default: pem\n\n"
          );
LAB_0010b634:
    iVar2 = 1;
  }
  else {
    opt.mode = 0;
    opt.filename = "keyfile.key";
    opt.output_mode = 0;
    opt.output_file = "keyfile.pem";
    opt.output_format = 0;
    if (argc < 2) goto LAB_0010b626;
    uVar6 = 1;
    do {
      pcVar5 = argv[uVar6];
      pcVar4 = strchr(pcVar5,0x3d);
      if (pcVar4 == (char *)0x0) goto LAB_0010b626;
      __s1 = pcVar4 + 1;
      *pcVar4 = '\0';
      iVar2 = strcmp(pcVar5,"mode");
      if (iVar2 == 0) {
        iVar2 = strcmp(__s1,"private");
        if (iVar2 == 0) {
          opt.mode = 1;
          pcVar4 = opt.filename;
          pcVar1 = opt.output_file;
        }
        else {
          iVar2 = strcmp(__s1,"public");
          if (iVar2 != 0) goto LAB_0010b626;
          opt.mode = 2;
          pcVar4 = opt.filename;
          pcVar1 = opt.output_file;
        }
      }
      else {
        iVar2 = strcmp(pcVar5,"output_mode");
        if (iVar2 == 0) {
          iVar2 = strcmp(__s1,"private");
          if (iVar2 == 0) {
            opt.output_mode = 1;
            pcVar4 = opt.filename;
            pcVar1 = opt.output_file;
          }
          else {
            iVar2 = strcmp(__s1,"public");
            if (iVar2 != 0) goto LAB_0010b626;
            opt.output_mode = 2;
            pcVar4 = opt.filename;
            pcVar1 = opt.output_file;
          }
        }
        else {
          iVar2 = strcmp(pcVar5,"output_format");
          if (iVar2 == 0) {
            iVar2 = strcmp(__s1,"pem");
            if (iVar2 == 0) {
              opt.output_format = 0;
              pcVar4 = opt.filename;
              pcVar1 = opt.output_file;
            }
            else {
              iVar2 = strcmp(__s1,"der");
              if (iVar2 != 0) goto LAB_0010b626;
              opt.output_format = 1;
              pcVar4 = opt.filename;
              pcVar1 = opt.output_file;
            }
          }
          else {
            iVar2 = strcmp(pcVar5,"filename");
            pcVar4 = __s1;
            pcVar1 = opt.output_file;
            if ((iVar2 != 0) &&
               (iVar2 = strcmp(pcVar5,"output_file"), pcVar4 = opt.filename, pcVar1 = __s1,
               iVar2 != 0)) goto LAB_0010b626;
          }
        }
      }
      opt.output_file = pcVar1;
      opt.filename = pcVar4;
      uVar6 = uVar6 + 1;
    } while ((uint)argc != uVar6);
    if (opt.output_mode != 0 && opt.mode == 0) {
      pcVar5 = "\nCannot output a key without reading one.";
LAB_0010b552:
      puts(pcVar5);
      goto LAB_0010b634;
    }
    if (opt.output_mode == 1 && opt.mode == 2) {
      pcVar5 = "\nCannot output a private key from a public key.";
      goto LAB_0010b552;
    }
    if (opt.mode == 1) {
      printf("\n  . Loading the private key ...");
      fflush(_stdout);
      iVar2 = mbedtls_pk_parse_keyfile(&mStack_508,opt.filename,(char *)0x0);
      if (iVar2 != 0) {
        mbedtls_strerror(iVar2,local_438,0x400);
        pcVar5 = " failed\n  !  mbedtls_pk_parse_keyfile returned -0x%04x - %s\n\n";
        goto LAB_0010b61a;
      }
      puts(" ok");
      puts("  . Key information    ...");
      mVar3 = mbedtls_pk_get_type(&mStack_508);
      if (mVar3 != MBEDTLS_PK_RSA) {
        mVar3 = mbedtls_pk_get_type(&mStack_508);
        if (mVar3 == MBEDTLS_PK_ECKEY) {
          mbedtls_mpi_write_file
                    ("Q(X): ",(mbedtls_mpi *)&((mbedtls_mpi *)((long)mStack_508.pk_ctx + 0x100))->p,
                     0x10,(FILE *)0x0);
          mbedtls_mpi_write_file
                    ("Q(Y): ",(mbedtls_mpi *)&((mbedtls_mpi *)((long)mStack_508.pk_ctx + 0x118))->p,
                     0x10,(FILE *)0x0);
          mbedtls_mpi_write_file
                    ("Q(Z): ",(mbedtls_mpi *)&((mbedtls_mpi *)((long)mStack_508.pk_ctx + 0x130))->p,
                     0x10,(FILE *)0x0);
          X = (mbedtls_mpi *)&((mbedtls_mpi *)((long)mStack_508.pk_ctx + 0xe8))->p;
          pcVar5 = "D   : ";
          goto LAB_0010b946;
        }
LAB_0010b954:
        puts("key type not supported yet");
LAB_0010b960:
        if (opt.output_mode == 2) {
          write_public_key(&mStack_508,opt.output_file);
        }
        iVar2 = 0;
        if (opt.output_mode == 1) {
          write_private_key(&mStack_508,opt.output_file);
        }
        goto LAB_0010b666;
      }
      iVar2 = mbedtls_rsa_export((mbedtls_rsa_context *)mStack_508.pk_ctx,&local_4e0,&local_450,
                                 &local_468,&local_480,&local_4f8);
      if ((iVar2 == 0) &&
         (iVar2 = mbedtls_rsa_export_crt
                            ((mbedtls_rsa_context *)mStack_508.pk_ctx,&local_498,&local_4b0,
                             &local_4c8), iVar2 == 0)) {
        mbedtls_mpi_write_file("N:  ",&local_4e0,0x10,(FILE *)0x0);
        mbedtls_mpi_write_file("E:  ",&local_4f8,0x10,(FILE *)0x0);
        mbedtls_mpi_write_file("D:  ",&local_480,0x10,(FILE *)0x0);
        mbedtls_mpi_write_file("P:  ",&local_450,0x10,(FILE *)0x0);
        mbedtls_mpi_write_file("Q:  ",&local_468,0x10,(FILE *)0x0);
        mbedtls_mpi_write_file("DP: ",&local_498,0x10,(FILE *)0x0);
        mbedtls_mpi_write_file("DQ:  ",&local_4b0,0x10,(FILE *)0x0);
        pcVar5 = "QP:  ";
        X = &local_4c8;
LAB_0010b946:
        mbedtls_mpi_write_file(pcVar5,X,0x10,(FILE *)0x0);
        goto LAB_0010b960;
      }
LAB_0010b868:
      puts(" failed\n  ! could not export RSA parameters\n");
    }
    else {
      if (opt.mode != 2) goto LAB_0010b626;
      printf("\n  . Loading the public key ...");
      fflush(_stdout);
      iVar2 = mbedtls_pk_parse_public_keyfile(&mStack_508,opt.filename);
      if (iVar2 == 0) {
        puts(" ok");
        puts("  . Key information    ...");
        mVar3 = mbedtls_pk_get_type(&mStack_508);
        if (mVar3 == MBEDTLS_PK_RSA) {
          iVar2 = mbedtls_rsa_export((mbedtls_rsa_context *)mStack_508.pk_ctx,&local_4e0,
                                     (mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,
                                     &local_4f8);
          if (iVar2 != 0) goto LAB_0010b868;
          mbedtls_mpi_write_file("N: ",&local_4e0,0x10,(FILE *)0x0);
          pcVar5 = "E: ";
          X = &local_4f8;
        }
        else {
          mVar3 = mbedtls_pk_get_type(&mStack_508);
          if (mVar3 != MBEDTLS_PK_ECKEY) goto LAB_0010b954;
          mbedtls_mpi_write_file
                    ("Q(X): ",(mbedtls_mpi *)&((mbedtls_mpi *)((long)mStack_508.pk_ctx + 0x100))->p,
                     0x10,(FILE *)0x0);
          mbedtls_mpi_write_file
                    ("Q(Y): ",(mbedtls_mpi *)&((mbedtls_mpi *)((long)mStack_508.pk_ctx + 0x118))->p,
                     0x10,(FILE *)0x0);
          X = (mbedtls_mpi *)&((mbedtls_mpi *)((long)mStack_508.pk_ctx + 0x130))->p;
          pcVar5 = "Q(Z): ";
        }
        goto LAB_0010b946;
      }
      mbedtls_strerror(iVar2,local_438,0x400);
      pcVar5 = " failed\n  !  mbedtls_pk_parse_public_key returned -0x%04x - %s\n\n";
LAB_0010b61a:
      printf(pcVar5,(ulong)(uint)-iVar2,local_438);
    }
  }
  mbedtls_strerror(iVar2,local_438,0x400);
  printf(" - %s\n",local_438);
  iVar2 = 1;
LAB_0010b666:
  mbedtls_mpi_free(&local_4e0);
  mbedtls_mpi_free(&local_450);
  mbedtls_mpi_free(&local_468);
  mbedtls_mpi_free(&local_480);
  mbedtls_mpi_free(&local_4f8);
  mbedtls_mpi_free(&local_498);
  mbedtls_mpi_free(&local_4b0);
  mbedtls_mpi_free(&local_4c8);
  mbedtls_pk_free(&mStack_508);
  return iVar2;
}

Assistant:

int main( int argc, char *argv[] )
{
    int ret = 1;
    int exit_code = MBEDTLS_EXIT_FAILURE;
    char buf[1024];
    int i;
    char *p, *q;

    mbedtls_pk_context key;
    mbedtls_mpi N, P, Q, D, E, DP, DQ, QP;

    /*
     * Set to sane values
     */
    mbedtls_pk_init( &key );
    memset( buf, 0, sizeof( buf ) );

    mbedtls_mpi_init( &N ); mbedtls_mpi_init( &P ); mbedtls_mpi_init( &Q );
    mbedtls_mpi_init( &D ); mbedtls_mpi_init( &E ); mbedtls_mpi_init( &DP );
    mbedtls_mpi_init( &DQ ); mbedtls_mpi_init( &QP );

    if( argc == 0 )
    {
    usage:
        mbedtls_printf( USAGE );
        goto exit;
    }

    opt.mode                = DFL_MODE;
    opt.filename            = DFL_FILENAME;
    opt.output_mode         = DFL_OUTPUT_MODE;
    opt.output_file         = DFL_OUTPUT_FILENAME;
    opt.output_format       = DFL_OUTPUT_FORMAT;

    for( i = 1; i < argc; i++ )
    {
        p = argv[i];
        if( ( q = strchr( p, '=' ) ) == NULL )
            goto usage;
        *q++ = '\0';

        if( strcmp( p, "mode" ) == 0 )
        {
            if( strcmp( q, "private" ) == 0 )
                opt.mode = MODE_PRIVATE;
            else if( strcmp( q, "public" ) == 0 )
                opt.mode = MODE_PUBLIC;
            else
                goto usage;
        }
        else if( strcmp( p, "output_mode" ) == 0 )
        {
            if( strcmp( q, "private" ) == 0 )
                opt.output_mode = OUTPUT_MODE_PRIVATE;
            else if( strcmp( q, "public" ) == 0 )
                opt.output_mode = OUTPUT_MODE_PUBLIC;
            else
                goto usage;
        }
        else if( strcmp( p, "output_format" ) == 0 )
        {
#if defined(MBEDTLS_PEM_WRITE_C)
            if( strcmp( q, "pem" ) == 0 )
                opt.output_format = OUTPUT_FORMAT_PEM;
            else
#endif
            if( strcmp( q, "der" ) == 0 )
                opt.output_format = OUTPUT_FORMAT_DER;
            else
                goto usage;
        }
        else if( strcmp( p, "filename" ) == 0 )
            opt.filename = q;
        else if( strcmp( p, "output_file" ) == 0 )
            opt.output_file = q;
        else
            goto usage;
    }

    if( opt.mode == MODE_NONE && opt.output_mode != OUTPUT_MODE_NONE )
    {
        mbedtls_printf( "\nCannot output a key without reading one.\n");
        goto exit;
    }

    if( opt.mode == MODE_PUBLIC && opt.output_mode == OUTPUT_MODE_PRIVATE )
    {
        mbedtls_printf( "\nCannot output a private key from a public key.\n");
        goto exit;
    }

    if( opt.mode == MODE_PRIVATE )
    {
        /*
         * 1.1. Load the key
         */
        mbedtls_printf( "\n  . Loading the private key ..." );
        fflush( stdout );

        ret = mbedtls_pk_parse_keyfile( &key, opt.filename, NULL );

        if( ret != 0 )
        {
            mbedtls_strerror( ret, (char *) buf, sizeof(buf) );
            mbedtls_printf( " failed\n  !  mbedtls_pk_parse_keyfile returned -0x%04x - %s\n\n", -ret, buf );
            goto exit;
        }

        mbedtls_printf( " ok\n" );

        /*
         * 1.2 Print the key
         */
        mbedtls_printf( "  . Key information    ...\n" );

#if defined(MBEDTLS_RSA_C)
        if( mbedtls_pk_get_type( &key ) == MBEDTLS_PK_RSA )
        {
            mbedtls_rsa_context *rsa = mbedtls_pk_rsa( key );

            if( ( ret = mbedtls_rsa_export    ( rsa, &N, &P, &Q, &D, &E ) ) != 0 ||
                ( ret = mbedtls_rsa_export_crt( rsa, &DP, &DQ, &QP ) )      != 0 )
            {
                mbedtls_printf( " failed\n  ! could not export RSA parameters\n\n" );
                goto exit;
            }

            mbedtls_mpi_write_file( "N:  ",  &N,  16, NULL );
            mbedtls_mpi_write_file( "E:  ",  &E,  16, NULL );
            mbedtls_mpi_write_file( "D:  ",  &D,  16, NULL );
            mbedtls_mpi_write_file( "P:  ",  &P,  16, NULL );
            mbedtls_mpi_write_file( "Q:  ",  &Q,  16, NULL );
            mbedtls_mpi_write_file( "DP: ",  &DP, 16, NULL );
            mbedtls_mpi_write_file( "DQ:  ", &DQ, 16, NULL );
            mbedtls_mpi_write_file( "QP:  ", &QP, 16, NULL );
        }
        else
#endif
#if defined(MBEDTLS_ECP_C)
        if( mbedtls_pk_get_type( &key ) == MBEDTLS_PK_ECKEY )
        {
            mbedtls_ecp_keypair *ecp = mbedtls_pk_ec( key );
            mbedtls_mpi_write_file( "Q(X): ", &ecp->Q.X, 16, NULL );
            mbedtls_mpi_write_file( "Q(Y): ", &ecp->Q.Y, 16, NULL );
            mbedtls_mpi_write_file( "Q(Z): ", &ecp->Q.Z, 16, NULL );
            mbedtls_mpi_write_file( "D   : ", &ecp->d  , 16, NULL );
        }
        else
#endif
            mbedtls_printf("key type not supported yet\n");

    }
    else if( opt.mode == MODE_PUBLIC )
    {
        /*
         * 1.1. Load the key
         */
        mbedtls_printf( "\n  . Loading the public key ..." );
        fflush( stdout );

        ret = mbedtls_pk_parse_public_keyfile( &key, opt.filename );

        if( ret != 0 )
        {
            mbedtls_strerror( ret, (char *) buf, sizeof(buf) );
            mbedtls_printf( " failed\n  !  mbedtls_pk_parse_public_key returned -0x%04x - %s\n\n", -ret, buf );
            goto exit;
        }

        mbedtls_printf( " ok\n" );

        /*
         * 1.2 Print the key
         */
        mbedtls_printf( "  . Key information    ...\n" );

#if defined(MBEDTLS_RSA_C)
        if( mbedtls_pk_get_type( &key ) == MBEDTLS_PK_RSA )
        {
            mbedtls_rsa_context *rsa = mbedtls_pk_rsa( key );

            if( ( ret = mbedtls_rsa_export( rsa, &N, NULL, NULL,
                                            NULL, &E ) ) != 0 )
            {
                mbedtls_printf( " failed\n  ! could not export RSA parameters\n\n" );
                goto exit;
            }
            mbedtls_mpi_write_file( "N: ", &N, 16, NULL );
            mbedtls_mpi_write_file( "E: ", &E, 16, NULL );
        }
        else
#endif
#if defined(MBEDTLS_ECP_C)
        if( mbedtls_pk_get_type( &key ) == MBEDTLS_PK_ECKEY )
        {
            mbedtls_ecp_keypair *ecp = mbedtls_pk_ec( key );
            mbedtls_mpi_write_file( "Q(X): ", &ecp->Q.X, 16, NULL );
            mbedtls_mpi_write_file( "Q(Y): ", &ecp->Q.Y, 16, NULL );
            mbedtls_mpi_write_file( "Q(Z): ", &ecp->Q.Z, 16, NULL );
        }
        else
#endif
            mbedtls_printf("key type not supported yet\n");
    }
    else
        goto usage;

    if( opt.output_mode == OUTPUT_MODE_PUBLIC )
    {
        write_public_key( &key, opt.output_file );
    }
    if( opt.output_mode == OUTPUT_MODE_PRIVATE )
    {
        write_private_key( &key, opt.output_file );
    }

    exit_code = MBEDTLS_EXIT_SUCCESS;

exit:

    if( exit_code != MBEDTLS_EXIT_SUCCESS )
    {
#ifdef MBEDTLS_ERROR_C
        mbedtls_strerror( ret, buf, sizeof( buf ) );
        mbedtls_printf( " - %s\n", buf );
#else
        mbedtls_printf("\n");
#endif
    }

    mbedtls_mpi_free( &N ); mbedtls_mpi_free( &P ); mbedtls_mpi_free( &Q );
    mbedtls_mpi_free( &D ); mbedtls_mpi_free( &E ); mbedtls_mpi_free( &DP );
    mbedtls_mpi_free( &DQ ); mbedtls_mpi_free( &QP );

    mbedtls_pk_free( &key );

#if defined(_WIN32)
    mbedtls_printf( "  + Press Enter to exit this program.\n" );
    fflush( stdout ); getchar();
#endif

    return( exit_code );
}